

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  
  iVar1 = test1();
  if (iVar1 == 0) {
    iVar1 = test2();
    if (iVar1 == 0) {
      iVar1 = 0;
      pcVar3 = "Ok";
      goto LAB_00102701;
    }
  }
  iVar1 = 1;
  pcVar3 = "Fail ";
LAB_00102701:
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return iVar1;
}

Assistant:

int main()
{
	if(test1()==0 && test2()==0) {
		std::cout << "Ok" << std::endl;
		return EXIT_SUCCESS;
	}
	else {
		std::cout << "Fail " << std::endl;
		return EXIT_FAILURE;
	}
}